

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  char cVar1;
  char cVar2;
  uchar uVar3;
  CURLcode CVar4;
  size_t sVar5;
  uchar *puVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uchar *puVar13;
  size_t padding;
  size_t sVar14;
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar5 = strlen(src);
  CVar4 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar5 & 3) == 0 && sVar5 != 0) {
    for (lVar11 = 0; src[lVar11] != '\0'; lVar11 = lVar11 + 1) {
      if (src[lVar11] == '=') {
        lVar8 = (ulong)(src[lVar11 + 1] == '=') + 1;
        goto LAB_00509aa6;
      }
    }
    lVar8 = 0;
LAB_00509aa6:
    if (sVar5 - lVar8 == lVar11) {
      sVar14 = (sVar5 >> 2) * 3 - lVar8;
      puVar6 = (uchar *)(*Curl_cmalloc)(sVar14 + 1);
      if (puVar6 == (uchar *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
      }
      else {
        puVar13 = puVar6;
        for (uVar12 = 0; uVar12 != sVar5 >> 2; uVar12 = uVar12 + 1) {
          lVar8 = 0;
          uVar10 = 0;
          pcVar7 = src;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            cVar1 = *pcVar7;
            if (cVar1 == '=') {
              uVar10 = uVar10 << 6;
              lVar8 = lVar8 + 1;
            }
            else {
              for (lVar9 = 0;
                  (cVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar9]
                  , cVar2 != '\0' && (cVar2 != cVar1)); lVar9 = lVar9 + 1) {
              }
              if (cVar2 != cVar1) goto LAB_00509ba5;
              uVar10 = uVar10 * 0x40 + lVar9;
            }
            pcVar7 = pcVar7 + 1;
          }
          if (lVar8 == 1) {
LAB_00509b6d:
            uVar3 = curlx_ultouc(uVar10 >> 8 & 0xff);
            puVar13[1] = uVar3;
          }
          else if (lVar8 == 0) {
            uVar3 = curlx_ultouc(uVar10 & 0xff);
            puVar13[2] = uVar3;
            goto LAB_00509b6d;
          }
          uVar3 = curlx_ultouc(uVar10 >> 0x10 & 0xff);
          *puVar13 = uVar3;
          if (lVar8 == 3) {
LAB_00509ba5:
            (*Curl_cfree)(puVar6);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar13 = puVar13 + (3 - lVar8);
          src = src + 4;
        }
        *puVar13 = '\0';
        *outptr = puVar6;
        *outlen = sVar14;
        CVar4 = CURLE_OK;
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t length = 0;
  size_t padding = 0;
  size_t i;
  size_t result;
  size_t numQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  while((src[length] != '=') && src[length])
    length++;

  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    padding++;
    if(src[length + 1] == '=')
      padding++;
  }

  /* Check the = padding characters weren't part way through the input */
  if(length + padding != srclen)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a zero terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    result = decodeQuantum(pos, src);
    if(!result) {
      Curl_safefree(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}